

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffcrhd(fitsfile *fptr,int *status)

{
  int *piVar1;
  LONGLONG bytepos;
  uint in_EAX;
  int iVar2;
  FITSfile *pFVar3;
  LONGLONG *pLVar4;
  ulong uStack_28;
  int tstatus;
  
  uStack_28 = (ulong)in_EAX;
  iVar2 = *status;
  if (iVar2 < 1) {
    iVar2 = fptr->HDUposition;
    pFVar3 = fptr->Fptr;
    if (iVar2 != pFVar3->curhdu) {
      ffmahd(fptr,iVar2 + 1,(int *)0x0,status);
      pFVar3 = fptr->Fptr;
      iVar2 = pFVar3->curhdu;
    }
    if (pFVar3->headend != pFVar3->headstart[iVar2]) {
      do {
        iVar2 = ffmrhd(fptr,1,(int *)0x0,&tstatus);
      } while (iVar2 == 0);
      pFVar3 = fptr->Fptr;
      if (pFVar3->maxhdu == pFVar3->MAXHDU) {
        pLVar4 = (LONGLONG *)realloc(pFVar3->headstart,(long)pFVar3->maxhdu * 8 + 0x1f48);
        if (pLVar4 == (LONGLONG *)0x0) {
          *status = 0x71;
          return 0x71;
        }
        pFVar3 = fptr->Fptr;
        piVar1 = &pFVar3->MAXHDU;
        *piVar1 = *piVar1 + 1000;
        pFVar3->headstart = pLVar4;
      }
      iVar2 = ffchdu(fptr,status);
      if (iVar2 < 1) {
        bytepos = fptr->Fptr->headstart[(long)fptr->Fptr->maxhdu + 1];
        ffmbyt(fptr,bytepos,1,status);
        pFVar3 = fptr->Fptr;
        iVar2 = pFVar3->maxhdu + 1;
        pFVar3->maxhdu = iVar2;
        pFVar3->curhdu = iVar2;
        fptr->HDUposition = iVar2;
        pFVar3->nextkey = bytepos;
        pFVar3->headend = bytepos;
        pFVar3->datastart = -1;
        pFVar3->dither_seed = pFVar3->request_dither_seed;
      }
    }
    iVar2 = *status;
  }
  return iVar2;
}

Assistant:

int ffcrhd(fitsfile *fptr,      /* I - FITS file pointer */
           int *status)         /* IO - error status     */
/*
  CReate Header Data unit:  Create, initialize, and move the i/o pointer
  to a new extension appended to the end of the FITS file.
*/
{
    int  tstatus = 0;
    LONGLONG bytepos, *ptr;

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* If the current header is empty, we don't have to do anything */
    if ((fptr->Fptr)->headend == (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] )
        return(*status);

    while (ffmrhd(fptr, 1, 0, &tstatus) == 0);  /* move to end of file */

    if ((fptr->Fptr)->maxhdu == (fptr->Fptr)->MAXHDU)
    {
        /* allocate more space for the headstart array */
        ptr = (LONGLONG*) realloc( (fptr->Fptr)->headstart,
                        ((fptr->Fptr)->MAXHDU + 1001) * sizeof(LONGLONG) );

        if (ptr == NULL)
           return (*status = MEMORY_ALLOCATION);
        else {
          (fptr->Fptr)->MAXHDU = (fptr->Fptr)->MAXHDU + 1000;
          (fptr->Fptr)->headstart = ptr;
        }
    }

    if (ffchdu(fptr, status) <= 0)  /* close the current HDU */
    {
      bytepos = (fptr->Fptr)->headstart[(fptr->Fptr)->maxhdu + 1]; /* last */
      ffmbyt(fptr, bytepos, IGNORE_EOF, status);  /* move file ptr to it */
      (fptr->Fptr)->maxhdu++;       /* increment the known number of HDUs */
      (fptr->Fptr)->curhdu = (fptr->Fptr)->maxhdu; /* set current HDU loc */
      fptr->HDUposition    = (fptr->Fptr)->maxhdu; /* set current HDU loc */
      (fptr->Fptr)->nextkey = bytepos;    /* next keyword = start of header */
      (fptr->Fptr)->headend = bytepos;          /* end of header */
      (fptr->Fptr)->datastart = DATA_UNDEFINED; /* start data unit undefined */

       /* any other needed resets */
       
       /* reset the dithering offset that may have been calculated for the */
       /* previous HDU back to the requested default value */
       (fptr->Fptr)->dither_seed = (fptr->Fptr)->request_dither_seed;
    }

    return(*status);
}